

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsimd.c
# Opt level: O2

void jsimd_h2v1_fancy_upsample
               (j_decompress_ptr cinfo,jpeg_component_info *compptr,JSAMPARRAY input_data,
               JSAMPARRAY *output_data_ptr)

{
  uint uVar1;
  bool bVar2;
  undefined1 auVar3 [15];
  undefined1 auVar4 [15];
  undefined1 auVar5 [15];
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  unkuint9 Var25;
  undefined1 auVar26 [11];
  undefined1 auVar27 [15];
  unkuint9 Var28;
  undefined1 auVar29 [11];
  undefined1 auVar30 [15];
  unkuint9 Var31;
  undefined1 auVar32 [11];
  undefined1 auVar33 [15];
  undefined1 auVar34 [15];
  undefined1 auVar35 [15];
  undefined1 auVar36 [15];
  undefined1 auVar37 [15];
  undefined1 auVar38 [15];
  ulong uVar39;
  ulong uVar40;
  ulong uVar41;
  undefined1 (*pauVar42) [16];
  JSAMPARRAY ppJVar43;
  undefined1 (*pauVar44) [16];
  short sVar45;
  short sVar46;
  short sVar47;
  short sVar48;
  short sVar49;
  short sVar50;
  short sVar51;
  short sVar52;
  ulong uVar53;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  short sVar57;
  short sVar58;
  short sVar59;
  short sVar60;
  short sVar61;
  short sVar62;
  short sVar63;
  short sVar64;
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  
  uVar1 = compptr->downsampled_width;
  uVar41 = (ulong)uVar1;
  if (((byte)simd_support & 0x80) != 0) {
    jsimd_h2v1_fancy_upsample_avx2();
    return;
  }
  if ((uVar41 != 0) && ((ulong)(uint)cinfo->max_v_samp_factor != 0)) {
    ppJVar43 = *output_data_ptr;
    uVar40 = (ulong)(uint)cinfo->max_v_samp_factor;
    do {
      pauVar42 = (undefined1 (*) [16])*input_data;
      pauVar44 = (undefined1 (*) [16])*ppJVar43;
      if ((uVar1 & 0xf) != 0) {
        (*pauVar42)[uVar41] = pauVar42[-1][uVar41 + 0xf];
      }
      auVar68[8] = 0xff;
      auVar68._0_8_ = 0xffffffffffffffff;
      auVar68[9] = 0xff;
      auVar68[10] = 0xff;
      auVar68[0xb] = 0xff;
      auVar68[0xc] = 0xff;
      auVar68[0xd] = 0xff;
      auVar68[0xe] = 0xff;
      auVar68[0xf] = 0xff;
      auVar68 = auVar68 >> 0x78 & *pauVar42;
      uVar39 = uVar41 + 0xf & 0xfffffffffffffff0;
      if (0x10 < uVar39) goto jsimd_h2v1_fancy_upsample_sse2_columnloop;
      do {
        auVar66 = ZEXT816(0xff00000000000000) << 0x40 & *pauVar42;
        while( true ) {
          auVar55 = *pauVar42;
          uVar53 = auVar55._0_8_;
          auVar54._0_8_ = uVar53 << 8;
          auVar54._8_8_ = auVar55._8_8_ << 8 | uVar53 >> 0x38;
          auVar54 = auVar54 | auVar68;
          auVar66 = auVar55 >> 8 | auVar66;
          auVar68 = auVar55 >> 0x78;
          auVar3[0xd] = 0;
          auVar3._0_13_ = auVar55._0_13_;
          auVar3[0xe] = auVar55[7];
          auVar6[0xc] = auVar55[6];
          auVar6._0_12_ = auVar55._0_12_;
          auVar6._13_2_ = auVar3._13_2_;
          auVar9[0xb] = 0;
          auVar9._0_11_ = auVar55._0_11_;
          auVar9._12_3_ = auVar6._12_3_;
          auVar12[10] = auVar55[5];
          auVar12._0_10_ = auVar55._0_10_;
          auVar12._11_4_ = auVar9._11_4_;
          auVar15[9] = 0;
          auVar15._0_9_ = auVar55._0_9_;
          auVar15._10_5_ = auVar12._10_5_;
          auVar18[8] = auVar55[4];
          auVar18._0_8_ = uVar53;
          auVar18._9_6_ = auVar15._9_6_;
          auVar24._7_8_ = 0;
          auVar24._0_7_ = auVar18._8_7_;
          Var25 = CONCAT81(SUB158(auVar24 << 0x40,7),auVar55[3]);
          auVar33._9_6_ = 0;
          auVar33._0_9_ = Var25;
          auVar26._1_10_ = SUB1510(auVar33 << 0x30,5);
          auVar26[0] = auVar55[2];
          auVar34._11_4_ = 0;
          auVar34._0_11_ = auVar26;
          auVar21[2] = auVar55[1];
          auVar21._0_2_ = auVar55._0_2_;
          auVar21._3_12_ = SUB1512(auVar34 << 0x20,3);
          auVar4[0xd] = 0;
          auVar4._0_13_ = auVar54._0_13_;
          auVar4[0xe] = auVar54[7];
          auVar7[0xc] = auVar54[6];
          auVar7._0_12_ = auVar54._0_12_;
          auVar7._13_2_ = auVar4._13_2_;
          auVar10[0xb] = 0;
          auVar10._0_11_ = auVar54._0_11_;
          auVar10._12_3_ = auVar7._12_3_;
          auVar13[10] = auVar54[5];
          auVar13._0_10_ = auVar54._0_10_;
          auVar13._11_4_ = auVar10._11_4_;
          auVar16[9] = 0;
          auVar16._0_9_ = auVar54._0_9_;
          auVar16._10_5_ = auVar13._10_5_;
          auVar19[8] = auVar54[4];
          auVar19._0_8_ = auVar54._0_8_;
          auVar19._9_6_ = auVar16._9_6_;
          auVar27._7_8_ = 0;
          auVar27._0_7_ = auVar19._8_7_;
          Var28 = CONCAT81(SUB158(auVar27 << 0x40,7),auVar54[3]);
          auVar35._9_6_ = 0;
          auVar35._0_9_ = Var28;
          auVar29._1_10_ = SUB1510(auVar35 << 0x30,5);
          auVar29[0] = auVar54[2];
          auVar36._11_4_ = 0;
          auVar36._0_11_ = auVar29;
          auVar22[2] = auVar54[1];
          auVar22._0_2_ = auVar54._0_2_;
          auVar22._3_12_ = SUB1512(auVar36 << 0x20,3);
          auVar5[0xd] = 0;
          auVar5._0_13_ = auVar66._0_13_;
          auVar5[0xe] = auVar66[7];
          auVar8[0xc] = auVar66[6];
          auVar8._0_12_ = auVar66._0_12_;
          auVar8._13_2_ = auVar5._13_2_;
          auVar11[0xb] = 0;
          auVar11._0_11_ = auVar66._0_11_;
          auVar11._12_3_ = auVar8._12_3_;
          auVar14[10] = auVar66[5];
          auVar14._0_10_ = auVar66._0_10_;
          auVar14._11_4_ = auVar11._11_4_;
          auVar17[9] = 0;
          auVar17._0_9_ = auVar66._0_9_;
          auVar17._10_5_ = auVar14._10_5_;
          auVar20[8] = auVar66[4];
          auVar20._0_8_ = auVar66._0_8_;
          auVar20._9_6_ = auVar17._9_6_;
          auVar30._7_8_ = 0;
          auVar30._0_7_ = auVar20._8_7_;
          Var31 = CONCAT81(SUB158(auVar30 << 0x40,7),auVar66[3]);
          auVar37._9_6_ = 0;
          auVar37._0_9_ = Var31;
          auVar32._1_10_ = SUB1510(auVar37 << 0x30,5);
          auVar32[0] = auVar66[2];
          auVar38._11_4_ = 0;
          auVar38._0_11_ = auVar32;
          auVar23[2] = auVar66[1];
          auVar23._0_2_ = auVar66._0_2_;
          auVar23._3_12_ = SUB1512(auVar38 << 0x20,3);
          sVar45 = (auVar55._0_2_ & 0xff) * 3;
          sVar46 = auVar21._2_2_ * 3;
          sVar47 = auVar26._0_2_ * 3;
          sVar48 = (short)Var25 * 3;
          sVar49 = auVar18._8_2_ * 3;
          sVar50 = auVar12._10_2_ * 3;
          sVar51 = auVar6._12_2_ * 3;
          sVar52 = (auVar3._13_2_ >> 8) * 3;
          sVar57 = (ushort)auVar55[8] * 3;
          sVar58 = (ushort)auVar55[9] * 3;
          sVar59 = (ushort)auVar55[10] * 3;
          sVar60 = (ushort)auVar55[0xb] * 3;
          sVar61 = (ushort)auVar55[0xc] * 3;
          sVar62 = (ushort)auVar55[0xd] * 3;
          sVar63 = (ushort)auVar55[0xe] * 3;
          sVar64 = (ushort)auVar55[0xf] * 3;
          auVar55._0_2_ = (ushort)((auVar54._0_2_ & 0xff) + 1 + sVar45) >> 2;
          auVar55._2_2_ = (ushort)(auVar22._2_2_ + 1 + sVar46) >> 2;
          auVar55._4_2_ = (ushort)(auVar29._0_2_ + 1 + sVar47) >> 2;
          auVar55._6_2_ = (ushort)((short)Var28 + 1 + sVar48) >> 2;
          auVar55._8_2_ = (ushort)(auVar19._8_2_ + 1 + sVar49) >> 2;
          auVar55._10_2_ = (ushort)(auVar13._10_2_ + 1 + sVar50) >> 2;
          auVar55._12_2_ = (ushort)(auVar7._12_2_ + 1 + sVar51) >> 2;
          auVar55._14_2_ = (ushort)((auVar4._13_2_ >> 8) + 1 + sVar52) >> 2;
          auVar65._0_2_ = (ushort)(auVar54[8] + 1 + sVar57) >> 2;
          auVar65._2_2_ = (ushort)(auVar54[9] + 1 + sVar58) >> 2;
          auVar65._4_2_ = (ushort)(auVar54[10] + 1 + sVar59) >> 2;
          auVar65._6_2_ = (ushort)(auVar54[0xb] + 1 + sVar60) >> 2;
          auVar65._8_2_ = (ushort)(auVar54[0xc] + 1 + sVar61) >> 2;
          auVar65._10_2_ = (ushort)(auVar54[0xd] + 1 + sVar62) >> 2;
          auVar65._12_2_ = (ushort)(auVar54[0xe] + 1 + sVar63) >> 2;
          auVar65._14_2_ = (ushort)(auVar54[0xf] + 1 + sVar64) >> 2;
          auVar56._0_2_ = (ushort)((auVar66._0_2_ & 0xff) + 2 + sVar45) >> 2;
          auVar56._2_2_ = (ushort)(auVar23._2_2_ + 2 + sVar46) >> 2;
          auVar56._4_2_ = (ushort)(auVar32._0_2_ + 2 + sVar47) >> 2;
          auVar56._6_2_ = (ushort)((short)Var31 + 2 + sVar48) >> 2;
          auVar56._8_2_ = (ushort)(auVar20._8_2_ + 2 + sVar49) >> 2;
          auVar56._10_2_ = (ushort)(auVar14._10_2_ + 2 + sVar50) >> 2;
          auVar56._12_2_ = (ushort)(auVar8._12_2_ + 2 + sVar51) >> 2;
          auVar56._14_2_ = (ushort)((auVar5._13_2_ >> 8) + 2 + sVar52) >> 2;
          auVar67._0_2_ = (ushort)(auVar66[8] + 2 + sVar57) >> 2;
          auVar67._2_2_ = (ushort)(auVar66[9] + 2 + sVar58) >> 2;
          auVar67._4_2_ = (ushort)(auVar66[10] + 2 + sVar59) >> 2;
          auVar67._6_2_ = (ushort)(auVar66[0xb] + 2 + sVar60) >> 2;
          auVar67._8_2_ = (ushort)(auVar66[0xc] + 2 + sVar61) >> 2;
          auVar67._10_2_ = (ushort)(auVar66[0xd] + 2 + sVar62) >> 2;
          auVar67._12_2_ = (ushort)(auVar66[0xe] + 2 + sVar63) >> 2;
          auVar67._14_2_ = (ushort)(auVar66[0xf] + 2 + sVar64) >> 2;
          auVar66 = psllw(auVar56,8);
          auVar54 = psllw(auVar67,8);
          *pauVar44 = auVar55 | auVar66;
          pauVar44[1] = auVar65 | auVar54;
          uVar39 = uVar39 - 0x10;
          pauVar42 = pauVar42 + 1;
          pauVar44 = pauVar44 + 2;
          if (uVar39 < 0x11) break;
jsimd_h2v1_fancy_upsample_sse2_columnloop:
          auVar66._8_8_ = 0;
          auVar66._0_8_ = *(long *)pauVar42[1] << 0x38;
          auVar66 = auVar66 << 0x40;
        }
      } while ((int)uVar39 != 0);
      input_data = input_data + 1;
      ppJVar43 = ppJVar43 + 1;
      uVar39 = uVar40 - 1;
      bVar2 = 0 < (long)uVar40;
      uVar40 = uVar39;
    } while (uVar39 != 0 && bVar2);
  }
  return;
}

Assistant:

GLOBAL(void)
jsimd_h2v1_fancy_upsample(j_decompress_ptr cinfo, jpeg_component_info *compptr,
                          JSAMPARRAY input_data, JSAMPARRAY *output_data_ptr)
{
  if (simd_support & JSIMD_AVX2)
    jsimd_h2v1_fancy_upsample_avx2(cinfo->max_v_samp_factor,
                                   compptr->downsampled_width, input_data,
                                   output_data_ptr);
  else
    jsimd_h2v1_fancy_upsample_sse2(cinfo->max_v_samp_factor,
                                   compptr->downsampled_width, input_data,
                                   output_data_ptr);
}